

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemberSymbols.cpp
# Opt level: O1

void __thiscall
slang::ast::NetAliasVisitor::visit<slang::ast::SimpleAssignmentPatternExpression>
          (NetAliasVisitor *this,SimpleAssignmentPatternExpression *expr)

{
  ExpressionKind EVar1;
  EvalContext *evalContext;
  NetType *pNVar2;
  size_t sVar3;
  pointer ppEVar4;
  Expression *this_00;
  ValueSymbol *pVVar5;
  Type *rootType;
  Diagnostic *pDVar6;
  long lVar7;
  optional<std::pair<unsigned_long,_unsigned_long>_> bounds;
  _Storage<std::pair<unsigned_long,_unsigned_long>,_true> local_60;
  char local_50;
  NetAlias local_48;
  
  EVar1 = (expr->super_AssignmentPatternExpressionBase).super_Expression.kind;
  if (2 < EVar1 - ElementSelect) {
    if (EVar1 == HierarchicalValue) {
      ASTContext::addDiag(this->context,(DiagCode)0x870006,
                          (expr->super_AssignmentPatternExpressionBase).super_Expression.sourceRange
                         );
      return;
    }
    if (EVar1 != NamedValue) {
      sVar3 = (expr->super_AssignmentPatternExpressionBase).elements_._M_extent._M_extent_value;
      if (sVar3 == 0) {
        return;
      }
      ppEVar4 = (expr->super_AssignmentPatternExpressionBase).elements_._M_ptr;
      lVar7 = 0;
      do {
        this_00 = *(Expression **)((long)ppEVar4 + lVar7);
        Expression::visitExpression<slang::ast::Expression_const,slang::ast::NetAliasVisitor&>
                  (this_00,this_00,this);
        lVar7 = lVar7 + 8;
      } while (sVar3 << 3 != lVar7);
      return;
    }
  }
  pVVar5 = (ValueSymbol *)Expression::getSymbolReference((Expression *)expr,true);
  if (pVVar5 != (ValueSymbol *)0x0) {
    if ((pVVar5->super_Symbol).kind != Net) {
      pDVar6 = ASTContext::addDiag(this->context,(DiagCode)0x880006,
                                   (expr->super_AssignmentPatternExpressionBase).super_Expression.
                                   sourceRange);
      Diagnostic::operator<<(pDVar6,(pVVar5->super_Symbol).name);
      return;
    }
    evalContext = this->evalCtx;
    rootType = DeclaredType::getType(&pVVar5->declaredType);
    ValueDriver::getBounds
              ((optional<std::pair<unsigned_long,_unsigned_long>_> *)&local_60._M_value,
               (Expression *)expr,evalContext,rootType);
    if (local_50 == '\x01') {
      local_48.bounds.first = local_60._M_value.first;
      local_48.bounds.second = local_60._M_value.second;
      local_48.sym.ptr = pVVar5;
      local_48.expr.ptr = (Expression *)expr;
      SmallVectorBase<slang::ast::NetAlias>::emplace_back<slang::ast::NetAlias>
                (&(this->netAliases).super_SmallVectorBase<slang::ast::NetAlias>,&local_48);
    }
    pNVar2 = *(NetType **)&pVVar5[1].super_Symbol;
    if (this->commonNetType == (NetType *)0x0) {
      this->commonNetType = pNVar2;
    }
    else if ((this->commonNetType != pNVar2) && (this->issuedError == false)) {
      pDVar6 = ASTContext::addDiag(this->context,(DiagCode)0x860006,
                                   (expr->super_AssignmentPatternExpressionBase).super_Expression.
                                   sourceRange);
      Diagnostic::operator<<(pDVar6,(pVVar5->super_Symbol).name);
      pDVar6 = Diagnostic::operator<<(pDVar6,(pNVar2->super_Symbol).name);
      Diagnostic::operator<<(pDVar6,(this->commonNetType->super_Symbol).name);
      this->issuedError = true;
    }
  }
  return;
}

Assistant:

void visit(const T& expr) {
        if constexpr (std::is_base_of_v<Expression, T>) {
            switch (expr.kind) {
                case ExpressionKind::NamedValue:
                case ExpressionKind::MemberAccess:
                case ExpressionKind::ElementSelect:
                case ExpressionKind::RangeSelect: {
                    if (auto sym = expr.getSymbolReference()) {
                        if (sym->kind != SymbolKind::Net) {
                            context.addDiag(diag::NetAliasNotANet, expr.sourceRange) << sym->name;
                        }
                        else {
                            auto& netSym = sym->template as<NetSymbol>();
                            if (auto bounds = ValueDriver::getBounds(expr, evalCtx,
                                                                     netSym.getType())) {
                                netAliases.push_back({&netSym, &expr, *bounds});
                            }

                            auto& nt = netSym.netType;
                            if (!commonNetType) {
                                commonNetType = &nt;
                            }
                            else if (commonNetType != &nt && !issuedError) {
                                auto& diag = context.addDiag(diag::NetAliasCommonNetType,
                                                             expr.sourceRange);
                                diag << sym->name;
                                diag << nt.name << commonNetType->name;
                                issuedError = true;
                            }
                        }
                    }
                    break;
                }
                case ExpressionKind::HierarchicalValue:
                    context.addDiag(diag::NetAliasHierarchical, expr.sourceRange);
                    break;
                default:
                    if constexpr (HasVisitExprs<T, NetAliasVisitor>)
                        expr.visitExprs(*this);
                    break;
            }
        }
    }